

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

ssize_t __thiscall
wasm::LEB<int,_signed_char>::write(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  uint uVar1;
  byte local_29 [8];
  uint8_t byte;
  
  uVar1 = this->value;
  while( true ) {
    local_29[0] = (byte)uVar1 & 0x7f;
    if ((0xfffffffd < ((int)uVar1 >> 7) - 1U) && (((uVar1 & 0x40) == 0) == -1 < this->value)) break;
    local_29[0] = (byte)uVar1 | 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_register_00000034,__fd),local_29);
    uVar1 = (int)uVar1 >> 7;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_register_00000034,__fd),local_29);
  return extraout_RAX;
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }